

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  __node_base_ptr *this_00;
  uint64_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int32_t iVar6;
  SPIRType *pSVar7;
  uint64_t uVar8;
  int64_t iVar9;
  CompilerError *pCVar10;
  int32_t value;
  int32_t value_00;
  char *pcVar11;
  bool local_ad1;
  bool local_ac9;
  string local_aa8;
  uint local_a88;
  int8_t local_a81;
  uint32_t i_14;
  string local_a60 [32];
  string local_a40;
  uint local_a20;
  int8_t local_a19;
  uint32_t i_13;
  uint8_t local_9f1;
  string local_9f0;
  string local_9d0 [32];
  string local_9b0;
  uint local_990;
  uint8_t local_989;
  uint32_t i_12;
  int16_t local_962;
  string local_960;
  string local_940 [38];
  int16_t local_91a;
  string local_918;
  string local_8f8;
  uint local_8d8;
  int16_t local_8d2;
  uint32_t i_11;
  uint16_t local_8aa;
  string local_8a8;
  string local_888 [38];
  uint16_t local_862;
  string local_860;
  string local_840;
  uint local_820;
  uint32_t local_81c;
  uint32_t i_10;
  string local_7f8;
  string local_7d8;
  uint local_7b4;
  undefined1 local_7b0 [4];
  uint32_t i_9;
  uint32_t local_78c;
  string local_788;
  string local_768;
  uint local_748;
  uint32_t local_744;
  uint32_t i_8;
  uint64_t local_720;
  string local_718;
  string local_6f8;
  uint local_6d4;
  uint64_t uStack_6d0;
  uint32_t i_7;
  string local_6c8;
  string local_6a8;
  string local_688;
  uint local_664;
  undefined1 local_660 [4];
  uint32_t i_6;
  undefined1 local_640 [8];
  string int64_type;
  SPIRType tmp;
  string local_4b0;
  uint local_48c;
  undefined1 local_488 [4];
  uint32_t i_5;
  string local_468;
  string local_448;
  string local_428;
  uint local_404;
  undefined1 local_400 [4];
  uint32_t i_4;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  uint local_37c;
  undefined1 local_378 [4];
  uint32_t i_3;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  uint local_2f4;
  uint32_t local_2f0;
  uint32_t i_2;
  uint32_t ident_1;
  uint32_t i_1;
  uint64_t ident;
  bool local_2d7;
  bool local_2d6;
  undefined1 local_2d5;
  uint32_t i;
  bool swizzle_splat;
  bool splat;
  undefined1 local_2c8 [8];
  SPIRType scalar_type;
  SPIRType type;
  uint32_t vector_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
  pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  this_00 = &scalar_type.member_name_cache._M_h._M_single_bucket;
  SPIRType::SPIRType((SPIRType *)this_00,pSVar7);
  SPIRType::SPIRType((SPIRType *)local_2c8,(SPIRType *)this_00);
  scalar_type.basetype = Void;
  local_2d5 = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_ac9 = false;
  if (((this->backend).use_constructor_splatting & 1U) != 0) {
    uVar3 = SPIRConstant::vector_size(c);
    local_ac9 = 1 < uVar3;
  }
  local_2d6 = local_ac9;
  local_ad1 = false;
  if (((this->backend).can_swizzle_scalar & 1U) != 0) {
    uVar3 = SPIRConstant::vector_size(c);
    local_ad1 = 1 < uVar3;
  }
  local_2d7 = local_ad1;
  bVar2 = type_is_floating_point((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  if (!bVar2) {
    local_2d7 = false;
  }
  if (((local_2d6 & 1U) != 0) || ((local_2d7 & 1U) != 0)) {
    for (ident._4_4_ = 0; uVar5 = ident._4_4_, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
        ident._4_4_ = ident._4_4_ + 1) {
      uVar3 = SPIRConstant::specialization_constant_id(c,vector,ident._4_4_);
      if (uVar3 != 0) {
        local_2d6 = false;
        local_2d7 = false;
        break;
      }
    }
  }
  if (((local_2d6 & 1U) != 0) || ((local_2d7 & 1U) != 0)) {
    if (type.super_IVariant._12_4_ == 0x40) {
      _ident_1 = SPIRConstant::scalar_u64(c,vector,0);
      for (i_2 = 1; uVar3 = i_2, uVar4 = SPIRConstant::vector_size(c), uVar1 = _ident_1,
          uVar3 < uVar4; i_2 = i_2 + 1) {
        uVar8 = SPIRConstant::scalar_u64(c,vector,i_2);
        if (uVar1 != uVar8) {
          local_2d6 = false;
          local_2d7 = false;
          break;
        }
      }
    }
    else {
      local_2f0 = SPIRConstant::scalar(c,vector,0);
      for (local_2f4 = 1; uVar5 = local_2f4, uVar4 = SPIRConstant::vector_size(c), uVar3 = local_2f0
          , uVar5 < uVar4; local_2f4 = local_2f4 + 1) {
        uVar4 = SPIRConstant::scalar(c,vector,local_2f4);
        if (uVar3 != uVar4) {
          local_2d6 = false;
          local_2d7 = false;
        }
      }
    }
  }
  uVar3 = SPIRConstant::vector_size(c);
  if ((1 < uVar3) && ((local_2d7 & 1U) == 0)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])
              (&local_338,this,&scalar_type.member_name_cache._M_h._M_single_bucket,0);
    ::std::operator+(&local_318,&local_338,"(");
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_318);
    ::std::__cxx11::string::~string((string *)&local_318);
    ::std::__cxx11::string::~string((string *)&local_338);
  }
  switch(type.super_IVariant.self.id) {
  case 2:
    if ((local_2d6 & 1U) == 0) {
      for (local_a88 = 0; uVar5 = local_a88, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_a88 = local_a88 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_a88), uVar3 == 0)) {
          uVar3 = SPIRConstant::scalar(c,vector,local_a88);
          pcVar11 = "false";
          if (uVar3 != 0) {
            pcVar11 = "true";
          }
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar11);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_a88);
          to_expression_abi_cxx11_(&local_aa8,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_aa8);
          ::std::__cxx11::string::~string((string *)&local_aa8);
        }
        uVar5 = local_a88 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      uVar3 = SPIRConstant::scalar(c,vector,0);
      pcVar11 = "false";
      if (uVar3 != 0) {
        pcVar11 = "true";
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar11);
    }
    break;
  case 3:
    if ((local_2d6 & 1U) == 0) {
      for (local_a20 = 0; uVar5 = local_a20, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_a20 = local_a20 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_a20), uVar3 == 0)) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])(local_a60,this,local_2c8,0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a60);
          ::std::__cxx11::string::~string(local_a60);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
          local_a81 = SPIRConstant::scalar_i8(c,vector,local_a20);
          convert_to_string<signed_char,_0>((string *)&i_14,&local_a81);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_14);
          ::std::__cxx11::string::~string((string *)&i_14);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_a20);
          to_expression_abi_cxx11_(&local_a40,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a40);
          ::std::__cxx11::string::~string((string *)&local_a40);
        }
        uVar5 = local_a20 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_a19 = SPIRConstant::scalar_i8(c,vector,0);
      convert_to_string<signed_char,_0>((string *)&i_13,&local_a19);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_13);
      ::std::__cxx11::string::~string((string *)&i_13);
    }
    break;
  case 4:
    if ((local_2d6 & 1U) == 0) {
      for (local_990 = 0; uVar5 = local_990, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_990 = local_990 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_990), uVar3 == 0)) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])(local_9d0,this,local_2c8,0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_9d0);
          ::std::__cxx11::string::~string(local_9d0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
          local_9f1 = SPIRConstant::scalar_u8(c,vector,local_990);
          convert_to_string<unsigned_char,_0>(&local_9f0,&local_9f1);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_9f0);
          ::std::__cxx11::string::~string((string *)&local_9f0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_990);
          to_expression_abi_cxx11_(&local_9b0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_9b0);
          ::std::__cxx11::string::~string((string *)&local_9b0);
        }
        uVar5 = local_990 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_989 = SPIRConstant::scalar_u8(c,vector,0);
      convert_to_string<unsigned_char,_0>((string *)&i_12,&local_989);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_12);
      ::std::__cxx11::string::~string((string *)&i_12);
    }
    break;
  case 5:
    if ((local_2d6 & 1U) == 0) {
      for (local_8d8 = 0; uVar5 = local_8d8, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_8d8 = local_8d8 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_8d8), uVar3 == 0)) {
          if (*(this->backend).int16_t_literal_suffix == '\0') {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_940,this,local_2c8,0);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_940);
            ::std::__cxx11::string::~string(local_940);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
            local_962 = SPIRConstant::scalar_i16(c,vector,local_8d8);
            convert_to_string<short,_0>(&local_960,&local_962);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_960);
            ::std::__cxx11::string::~string((string *)&local_960);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
          }
          else {
            local_91a = SPIRConstant::scalar_i16(c,vector,local_8d8);
            convert_to_string<short,_0>(&local_918,&local_91a);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_918);
            ::std::__cxx11::string::~string((string *)&local_918);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(this->backend).int16_t_literal_suffix);
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_8d8);
          to_expression_abi_cxx11_(&local_8f8,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_8f8);
          ::std::__cxx11::string::~string((string *)&local_8f8);
        }
        uVar5 = local_8d8 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_8d2 = SPIRConstant::scalar_i16(c,vector,0);
      convert_to_string<short,_0>((string *)&i_11,&local_8d2);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_11);
      ::std::__cxx11::string::~string((string *)&i_11);
    }
    break;
  case 6:
    if ((local_2d6 & 1U) == 0) {
      for (local_820 = 0; uVar5 = local_820, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_820 = local_820 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_820), uVar3 == 0)) {
          if (*(this->backend).uint16_t_literal_suffix == '\0') {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_888,this,local_2c8,0);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_888);
            ::std::__cxx11::string::~string(local_888);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
            local_8aa = SPIRConstant::scalar_u16(c,vector,local_820);
            convert_to_string<unsigned_short,_0>(&local_8a8,&local_8aa);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_8a8);
            ::std::__cxx11::string::~string((string *)&local_8a8);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
          }
          else {
            local_862 = SPIRConstant::scalar_u16(c,vector,local_820);
            convert_to_string<unsigned_short,_0>(&local_860,&local_862);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_860);
            ::std::__cxx11::string::~string((string *)&local_860);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(this->backend).uint16_t_literal_suffix);
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_820);
          to_expression_abi_cxx11_(&local_840,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_840);
          ::std::__cxx11::string::~string((string *)&local_840);
        }
        uVar5 = local_820 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_81c = SPIRConstant::scalar(c,vector,0);
      convert_to_string<unsigned_int,_0>((string *)&i_10,&local_81c);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_10);
      ::std::__cxx11::string::~string((string *)&i_10);
    }
    break;
  case 7:
    if ((local_2d6 & 1U) == 0) {
      for (local_7b4 = 0; uVar5 = local_7b4, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_7b4 = local_7b4 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_7b4), uVar3 == 0)) {
          uVar5 = SPIRConstant::scalar_i32(c,vector,local_7b4);
          convert_to_string_abi_cxx11_(&local_7f8,(spirv_cross *)(ulong)uVar5,value_00);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7f8);
          ::std::__cxx11::string::~string((string *)&local_7f8);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_7b4);
          to_expression_abi_cxx11_(&local_7d8,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7d8);
          ::std::__cxx11::string::~string((string *)&local_7d8);
        }
        uVar5 = local_7b4 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      uVar5 = SPIRConstant::scalar_i32(c,vector,0);
      convert_to_string_abi_cxx11_((string *)local_7b0,(spirv_cross *)(ulong)uVar5,value);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_7b0);
      ::std::__cxx11::string::~string((string *)local_7b0);
    }
    break;
  case 8:
    if ((local_2d6 & 1U) == 0) {
      for (local_748 = 0; uVar5 = local_748, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_748 = local_748 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_748), uVar3 == 0)) {
          local_78c = SPIRConstant::scalar(c,vector,local_748);
          convert_to_string<unsigned_int,_0>(&local_788,&local_78c);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_788);
          ::std::__cxx11::string::~string((string *)&local_788);
          bVar2 = is_legacy(this);
          if (bVar2) {
            iVar6 = SPIRConstant::scalar_i32(c,vector,local_748);
            if (iVar6 < 0) {
              pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar10,
                         "Tried to convert uint literal into int, but this made the literal negative."
                        );
              __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
          else if (((this->backend).uint32_t_literal_suffix & 1U) != 0) {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"u");
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_748);
          to_expression_abi_cxx11_(&local_768,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_768);
          ::std::__cxx11::string::~string((string *)&local_768);
        }
        uVar5 = local_748 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_744 = SPIRConstant::scalar(c,vector,0);
      convert_to_string<unsigned_int,_0>((string *)&i_8,&local_744);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_8);
      ::std::__cxx11::string::~string((string *)&i_8);
      bVar2 = is_legacy(this);
      if (bVar2) {
        iVar6 = SPIRConstant::scalar_i32(c,vector,0);
        if (iVar6 < 0) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar10,
                     "Tried to convert uint literal into int, but this made the literal negative.");
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      else if (((this->backend).uint32_t_literal_suffix & 1U) != 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"u");
      }
    }
    break;
  case 9:
    SPIRType::SPIRType((SPIRType *)((long)&int64_type.field_2 + 8),
                       (SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
    tmp.basetype = Void;
    tmp.width = 1;
    (*(this->super_Compiler)._vptr_Compiler[0x13])
              (local_640,this,(undefined1 *)((long)&int64_type.field_2 + 8),0);
    if ((local_2d6 & 1U) == 0) {
      for (local_664 = 0; uVar5 = local_664, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_664 = local_664 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_664), uVar3 == 0)) {
          iVar9 = SPIRConstant::scalar_i64(c,vector,local_664);
          convert_to_string(&local_6a8,iVar9,(string *)local_640,
                            (bool)((this->backend).long_long_literal_suffix & 1));
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6a8);
          ::std::__cxx11::string::~string((string *)&local_6a8);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_664);
          to_expression_abi_cxx11_(&local_688,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_688);
          ::std::__cxx11::string::~string((string *)&local_688);
        }
        uVar5 = local_664 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      iVar9 = SPIRConstant::scalar_i64(c,vector,0);
      convert_to_string((string *)local_660,iVar9,(string *)local_640,
                        (bool)((this->backend).long_long_literal_suffix & 1));
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_660);
      ::std::__cxx11::string::~string((string *)local_660);
    }
    ::std::__cxx11::string::~string((string *)local_640);
    SPIRType::~SPIRType((SPIRType *)((long)&int64_type.field_2 + 8));
    break;
  case 10:
    if ((local_2d6 & 1U) == 0) {
      for (local_6d4 = 0; uVar5 = local_6d4, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_6d4 = local_6d4 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_6d4), uVar3 == 0)) {
          local_720 = SPIRConstant::scalar_u64(c,vector,local_6d4);
          convert_to_string<unsigned_long,_0>(&local_718,&local_720);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_718);
          ::std::__cxx11::string::~string((string *)&local_718);
          if (((this->backend).long_long_literal_suffix & 1U) == 0) {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ul");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ull");
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_6d4);
          to_expression_abi_cxx11_(&local_6f8,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6f8);
          ::std::__cxx11::string::~string((string *)&local_6f8);
        }
        uVar5 = local_6d4 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      uStack_6d0 = SPIRConstant::scalar_u64(c,vector,0);
      convert_to_string<unsigned_long,_0>(&local_6c8,&stack0xfffffffffffff930);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6c8);
      ::std::__cxx11::string::~string((string *)&local_6c8);
      if (((this->backend).long_long_literal_suffix & 1U) == 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ul");
      }
      else {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ull");
      }
    }
    break;
  default:
    pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar10,"Invalid constant expression basetype.");
    __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0xc:
    if (((local_2d6 & 1U) == 0) && ((local_2d7 & 1U) == 0)) {
      for (local_37c = 0; uVar5 = local_37c, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_37c = local_37c + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_37c), uVar3 == 0)) {
          convert_half_to_string_abi_cxx11_(&local_3c0,this,c,vector,local_37c);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3c0);
          ::std::__cxx11::string::~string((string *)&local_3c0);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_37c);
          to_expression_abi_cxx11_(&local_3a0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3a0);
          ::std::__cxx11::string::~string((string *)&local_3a0);
        }
        uVar5 = local_37c + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      convert_half_to_string_abi_cxx11_(&local_358,this,c,vector,0);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_358);
      ::std::__cxx11::string::~string((string *)&local_358);
      if ((local_2d7 & 1U) != 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
        pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
        remap_swizzle((string *)local_378,this,pSVar7,1,__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_378);
        ::std::__cxx11::string::~string((string *)local_378);
      }
    }
    break;
  case 0xd:
    if (((local_2d6 & 1U) == 0) && ((local_2d7 & 1U) == 0)) {
      for (local_404 = 0; uVar5 = local_404, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_404 = local_404 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_404), uVar3 == 0)) {
          convert_float_to_string_abi_cxx11_(&local_448,this,c,vector,local_404);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_448);
          ::std::__cxx11::string::~string((string *)&local_448);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_404);
          to_expression_abi_cxx11_(&local_428,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_428);
          ::std::__cxx11::string::~string((string *)&local_428);
        }
        uVar5 = local_404 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      convert_float_to_string_abi_cxx11_(&local_3e0,this,c,vector,0);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3e0);
      ::std::__cxx11::string::~string((string *)&local_3e0);
      if ((local_2d7 & 1U) != 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
        pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
        remap_swizzle((string *)local_400,this,pSVar7,1,__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_400);
        ::std::__cxx11::string::~string((string *)local_400);
      }
    }
    break;
  case 0xe:
    if (((local_2d6 & 1U) == 0) && ((local_2d7 & 1U) == 0)) {
      for (local_48c = 0; uVar5 = local_48c, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_48c = local_48c + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_48c), uVar3 == 0)) {
          convert_double_to_string_abi_cxx11_
                    ((string *)&tmp.member_name_cache._M_h._M_single_bucket,this,c,vector,local_48c)
          ;
          ::std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,
                     (string *)&tmp.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string((string *)&tmp.member_name_cache._M_h._M_single_bucket);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_48c);
          to_expression_abi_cxx11_(&local_4b0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4b0);
          ::std::__cxx11::string::~string((string *)&local_4b0);
        }
        uVar5 = local_48c + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      convert_double_to_string_abi_cxx11_(&local_468,this,c,vector,0);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_468);
      ::std::__cxx11::string::~string((string *)&local_468);
      if ((local_2d7 & 1U) != 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
        pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
        remap_swizzle((string *)local_488,this,pSVar7,1,__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_488);
        ::std::__cxx11::string::~string((string *)local_488);
      }
    }
  }
  uVar3 = SPIRConstant::vector_size(c);
  if ((1 < uVar3) && ((local_2d7 & 1U) == 0)) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  local_2d5 = 1;
  SPIRType::~SPIRType((SPIRType *)local_2c8);
  SPIRType::~SPIRType((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy())
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy())
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}